

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O1

uint64_t __thiscall
absl::anon_unknown_0::ShiftRightAndRound
          (anon_unknown_0 *this,uint128 value,int shift,bool input_exact,
          Nonnull<bool_*> output_exact)

{
  uint64_t uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000081;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = value.lo_;
  bVar3 = (byte)value.hi_;
  bVar7 = (byte)shift;
  if ((int)value.hi_ < 1) {
    *(byte *)CONCAT71(in_register_00000081,input_exact) = bVar7;
    uVar1 = 0;
    if ((-bVar3 & 0x40) == 0) {
      uVar1 = (long)this << (-bVar3 & 0x3f);
    }
    return uVar1;
  }
  *(undefined1 *)CONCAT71(in_register_00000081,input_exact) = 1;
  if (0x7f < (int)value.hi_) {
    return 0;
  }
  uVar2 = (ulong)this >> (bVar3 & 0x3f) | uVar6 << 0x40 - (bVar3 & 0x3f);
  if (((undefined1  [16])value & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
    uVar2 = uVar6 >> (bVar3 & 0x3f);
  }
  uVar4 = -1L << (bVar3 & 0x3f);
  uVar5 = uVar4;
  uVar8 = 0;
  if (((undefined1  [16])value & (undefined1  [16])0x40) == (undefined1  [16])0x0) {
    uVar5 = 0xffffffffffffffff;
    uVar8 = uVar4;
  }
  bVar3 = bVar3 - 1;
  uVar9 = 1L << (bVar3 & 0x3f);
  uVar10 = uVar9;
  uVar4 = 0L << (bVar3 & 0x3f) | 1UL >> 0x40 - (bVar3 & 0x3f);
  if ((bVar3 & 0x40) != 0) {
    uVar10 = 0;
    uVar4 = uVar9;
  }
  uVar8 = ~uVar8 & (ulong)this;
  uVar6 = ~uVar5 & uVar6;
  if (uVar6 <= uVar4 && (ulong)(uVar10 < uVar8) <= uVar4 - uVar6) {
    if (uVar6 != uVar4 || uVar8 != uVar10) {
      if ((uVar6 != (uVar4 - 1) + (ulong)(uVar10 != 0) || uVar8 != uVar10 - 1) || bVar7 != 0) {
        return uVar2;
      }
      *(undefined1 *)CONCAT71(in_register_00000081,input_exact) = 0;
      return uVar2;
    }
    if (((uVar2 & 1) == 0 & bVar7) != 0) {
      return uVar2;
    }
  }
  return uVar2 + 1;
}

Assistant:

uint64_t ShiftRightAndRound(uint128 value, int shift, bool input_exact,
                            absl::Nonnull<bool*> output_exact) {
  if (shift <= 0) {
    *output_exact = input_exact;
    return static_cast<uint64_t>(value << -shift);
  }
  if (shift >= 128) {
    // Exponent is so small that we are shifting away all significant bits.
    // Answer will not be representable, even as a subnormal, so return a zero
    // mantissa (which represents underflow).
    *output_exact = true;
    return 0;
  }

  *output_exact = true;
  const uint128 shift_mask = (uint128(1) << shift) - 1;
  const uint128 halfway_point = uint128(1) << (shift - 1);

  const uint128 shifted_bits = value & shift_mask;
  value >>= shift;
  if (shifted_bits > halfway_point) {
    // Shifted bits greater than 10000... require rounding up.
    return static_cast<uint64_t>(value + 1);
  }
  if (shifted_bits == halfway_point) {
    // In exact mode, shifted bits of 10000... mean we're exactly halfway
    // between two numbers, and we must round to even.  So only round up if
    // the low bit of `value` is set.
    //
    // In inexact mode, the nonzero error means the actual value is greater
    // than the halfway point and we must always round up.
    if ((value & 1) == 1 || !input_exact) {
      ++value;
    }
    return static_cast<uint64_t>(value);
  }
  if (!input_exact && shifted_bits == halfway_point - 1) {
    // Rounding direction is unclear, due to error.
    *output_exact = false;
  }
  // Otherwise, round down.
  return static_cast<uint64_t>(value);
}